

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O3

void __thiscall
InterpGCTest_Collect_Basic_Test::InterpGCTest_Collect_Basic_Test
          (InterpGCTest_Collect_Basic_Test *this)

{
  Features local_14;
  
  testing::Test::Test((Test *)this);
  (this->super_InterpGCTest).super_InterpTest.super_Test._vptr_Test =
       (_func_int **)&PTR__InterpTest_002bdc70;
  local_14.exceptions_enabled_ = false;
  local_14.mutable_globals_enabled_ = true;
  local_14.sat_float_to_int_enabled_ = false;
  local_14.sign_extension_enabled_ = false;
  local_14.simd_enabled_ = false;
  local_14.threads_enabled_ = false;
  local_14.multi_value_enabled_ = false;
  local_14.tail_call_enabled_ = false;
  local_14.bulk_memory_enabled_ = false;
  local_14.reference_types_enabled_ = false;
  local_14.annotations_enabled_ = false;
  local_14.gc_enabled_ = false;
  wabt::interp::Store::Store(&(this->super_InterpGCTest).super_InterpTest.store_,&local_14);
  memset(&(this->super_InterpGCTest).super_InterpTest.module_desc_,0,0x150);
  (this->super_InterpGCTest).super_InterpTest.super_Test._vptr_Test =
       (_func_int **)&PTR__InterpTest_002bd970;
  return;
}

Assistant:

TEST_F(InterpGCTest, Collect_Basic) {
  auto foreign = Foreign::New(store_, nullptr);
  auto after_new = store_.object_count();
  EXPECT_EQ(before_new + 1, after_new);

  // Remove root, but object is not destroyed until collect.
  foreign.reset();
  EXPECT_EQ(after_new, store_.object_count());
}